

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-select.c
# Opt level: O2

ssh_hash * sha512_select(ssh_hashalg *alg)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 *puVar3;
  byte bVar4;
  ssh_hash *psVar5;
  long *plVar6;
  
  plVar6 = (long *)alg->extra;
  while( true ) {
    puVar1 = (undefined8 *)*plVar6;
    if (puVar1 == (undefined8 *)0x0) {
      __assert_fail("false && \"sha512_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha512-select.c"
                    ,0x2c,"ssh_hash *sha512_select(const ssh_hashalg *)");
    }
    lVar2 = puVar1[10];
    if (**(char **)(lVar2 + 0x10) == '\0') {
      bVar4 = (**(code **)(lVar2 + 8))();
      puVar3 = *(undefined1 **)(lVar2 + 0x10);
      puVar3[1] = bVar4;
      *puVar3 = 1;
    }
    else {
      bVar4 = (*(char **)(lVar2 + 0x10))[1] & 1;
    }
    if (bVar4 != 0) break;
    plVar6 = plVar6 + 1;
  }
  psVar5 = (ssh_hash *)(*(code *)*puVar1)(puVar1);
  if (psVar5 != (ssh_hash *)0x0) {
    (*psVar5->vt->reset)(psVar5);
  }
  return psVar5;
}

Assistant:

static ssh_hash *sha512_select(const ssh_hashalg *alg)
{
    const ssh_hashalg *const *real_algs =
        (const ssh_hashalg *const *)alg->extra;

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha512_extra *alg_extra =
            (const struct sha512_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-512, which
     * is always available. */
    unreachable("sha512_select ran off the end of its list");
}